

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_location.hpp
# Opt level: O1

basic_json_location<char,_std::allocator<char>_> *
jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>::parse
          (basic_json_location<char,_std::allocator<char>_> *__return_storage_ptr__,
          basic_string_view<char,_std::char_traits<char>_> *normalized_path)

{
  vector<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
  location;
  json_location_parser<char,_std::allocator<char>_> parser;
  path_type local_58;
  json_location_parser<char,_std::allocator<char>_> local_38;
  
  local_38.line_ = 1;
  local_38.column_ = 1;
  local_38.end_input_ = (char_type *)0x0;
  local_38.p_ = (char_type *)0x0;
  detail::json_location_parser<char,_std::allocator<char>_>::parse
            (&local_58,&local_38,normalized_path);
  (__return_storage_ptr__->elements_).
  super__Vector_base<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->elements_).
  super__Vector_base<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->elements_).
  super__Vector_base<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_path_element<char,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

static basic_json_location parse(const jsoncons::basic_string_view<char_type>& normalized_path)
        {
            jsonpath::detail::json_location_parser<char,std::allocator<char>> parser;

            std::vector<value_type> location = parser.parse(normalized_path);
            return basic_json_location(std::move(location));
        }